

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

int64_t duckdb::DatePart::DecadeOperator::Operation<duckdb::dtime_t,long>(dtime_t input)

{
  NotImplementedException *this;
  allocator local_39;
  string local_38;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"\"time\" units \"decade\" not recognized",&local_39);
  NotImplementedException::NotImplementedException(this,&local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::DecadeOperator::Operation(dtime_t input) {
	throw NotImplementedException("\"time\" units \"decade\" not recognized");
}